

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_graph_dump_dot(ggml_cgraph *gb,ggml_cgraph *gf,char *filename)

{
  ggml_tensor *pgVar1;
  int64_t iVar2;
  _Bool _Var3;
  FILE *__stream;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  size_t sVar6;
  char *pcVar7;
  int64_t iVar8;
  undefined8 in_RDX;
  ggml_cgraph *in_RSI;
  long in_RDI;
  char label_1 [16];
  int j_2;
  ggml_tensor *node_3;
  int i_3;
  char label [16];
  int j_1;
  ggml_tensor *node_2;
  int i_2;
  int j;
  ggml_tensor *node_1;
  int i_1;
  ggml_tensor *grad;
  ggml_tensor *node;
  int i;
  FILE *fp;
  char color [16];
  char *in_stack_fffffffffffffea8;
  ggml_tensor *in_stack_fffffffffffffeb0;
  ggml_tensor *in_stack_fffffffffffffeb8;
  ggml_tensor *in_stack_fffffffffffffec0;
  ggml_cgraph *in_stack_fffffffffffffec8;
  FILE *__stream_00;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  ggml_tensor *in_stack_fffffffffffffef8;
  ggml_tensor *in_stack_ffffffffffffff00;
  ggml_cgraph *in_stack_ffffffffffffff08;
  FILE *in_stack_ffffffffffffff10;
  char local_b8 [28];
  uint local_9c;
  long lVar9;
  int iVar10;
  char local_88 [4];
  uint local_6c;
  int local_60;
  int local_5c;
  uint local_4c;
  uint local_34;
  char local_28 [16];
  undefined8 local_18;
  ggml_cgraph *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  __stream = (FILE *)ggml_fopen((char *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"digraph G {\n");
    fprintf(__stream,"  newrank = true;\n");
    fprintf(__stream,"  rankdir = TB;\n");
    for (local_34 = 0; (int)local_34 < *(int *)(local_8 + 4); local_34 = local_34 + 1) {
      pgVar1 = *(ggml_tensor **)(*(long *)(local_8 + 0x10) + (long)(int)local_34 * 8);
      pgVar4 = ggml_graph_get_grad((ggml_cgraph *)in_stack_fffffffffffffec0,
                                   in_stack_fffffffffffffeb8);
      pgVar5 = ggml_graph_get_parent(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      if (pgVar5 == (ggml_tensor *)0x0) {
        if ((pgVar1->flags & 4U) == 0) {
          if (pgVar4 == (ggml_tensor *)0x0) {
            snprintf(local_28,0x10,"white");
          }
          else {
            _Var3 = ggml_graph_find(local_10,pgVar1);
            if (_Var3) {
              snprintf(local_28,0x10,"green");
            }
            else {
              snprintf(local_28,0x10,"lightblue");
            }
          }
        }
        else {
          snprintf(local_28,0x10,"yellow");
        }
        fprintf(__stream,"  \"%p\" [ style = filled; fillcolor = %s; shape = record; label=\"",
                pgVar1,local_28);
        sVar6 = strlen(pgVar1->name);
        if (sVar6 == 0) {
          pcVar7 = ggml_type_name(pgVar1->type);
          fprintf(__stream,"(%s)|",pcVar7);
        }
        else {
          pcVar7 = ggml_type_name(pgVar1->type);
          fprintf(__stream,"%s (%s)|",pgVar1->name,pcVar7);
        }
        _Var3 = ggml_is_matrix(pgVar1);
        if (_Var3) {
          iVar8 = pgVar1->ne[0];
          iVar2 = pgVar1->ne[1];
          in_stack_ffffffffffffff10 = __stream;
          pcVar7 = ggml_op_symbol(pgVar1->op);
          fprintf(in_stack_ffffffffffffff10,"%d [%ld, %ld] | <x>%s",(ulong)local_34,iVar8,iVar2,
                  pcVar7);
        }
        else {
          in_stack_fffffffffffffef8 = (ggml_tensor *)pgVar1->ne[0];
          in_stack_ffffffffffffff00 = (ggml_tensor *)pgVar1->ne[1];
          in_stack_ffffffffffffff08 = (ggml_cgraph *)pgVar1->ne[2];
          in_stack_fffffffffffffef4 = local_34;
          in_stack_fffffffffffffea8 = ggml_op_symbol(pgVar1->op);
          fprintf(__stream,"%d [%ld, %ld, %ld] | <x>%s",(ulong)in_stack_fffffffffffffef4,
                  in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
        }
        if (pgVar4 == (ggml_tensor *)0x0) {
          fprintf(__stream,"\"; ]\n");
        }
        else {
          pcVar7 = ggml_op_symbol(pgVar4->op);
          fprintf(__stream," | <g>%s\"; ]\n",pcVar7);
        }
      }
    }
    for (local_4c = 0; (int)local_4c < *(int *)(local_8 + 8); local_4c = local_4c + 1) {
      pgVar1 = *(ggml_tensor **)(*(long *)(local_8 + 0x28) + (long)(int)local_4c * 8);
      snprintf(local_28,0x10,"pink");
      fprintf(__stream,"  \"%p\" [ style = filled; fillcolor = %s; shape = record; label=\"<x>",
              pgVar1,local_28);
      sVar6 = strlen(pgVar1->name);
      if (sVar6 == 0) {
        __stream_00 = __stream;
        pcVar7 = ggml_type_name(pgVar1->type);
        fprintf(__stream_00,"(%s)|",pcVar7);
      }
      else {
        pcVar7 = ggml_type_name(pgVar1->type);
        fprintf(__stream,"%s (%s)|",pgVar1->name,pcVar7);
      }
      fprintf(__stream,"CONST %d [%ld, %ld]",(ulong)local_4c,pgVar1->ne[0],pgVar1->ne[1]);
      iVar8 = ggml_nelements(pgVar1);
      if ((iVar8 < 5) && (pgVar1->data != (void *)0x0)) {
        fprintf(__stream," | (");
        local_5c = 0;
        while( true ) {
          in_stack_fffffffffffffec0 = (ggml_tensor *)(long)local_5c;
          iVar8 = ggml_nelements(pgVar1);
          if (iVar8 <= (long)in_stack_fffffffffffffec0) break;
          fprintf(__stream,"#");
          in_stack_fffffffffffffeb8 = (ggml_tensor *)(long)local_5c;
          iVar8 = ggml_nelements(pgVar1);
          if ((long)in_stack_fffffffffffffeb8 < iVar8 + -1) {
            fprintf(__stream,", ");
          }
          local_5c = local_5c + 1;
        }
        fprintf(__stream,")");
      }
      fprintf(__stream,"\"; ]\n");
    }
    for (local_60 = 0; local_60 < *(int *)(local_8 + 4); local_60 = local_60 + 1) {
      lVar9 = *(long *)(*(long *)(local_8 + 0x10) + (long)local_60 * 8);
      for (local_6c = 0; (int)local_6c < 10; local_6c = local_6c + 1) {
        if (*(long *)(lVar9 + 0x98 + (long)(int)local_6c * 8) != 0) {
          snprintf(local_88,0x10,"src %d",(ulong)local_6c);
          ggml_graph_dump_dot_node_edge
                    ((FILE *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        }
      }
    }
    for (iVar10 = 0; iVar10 < *(int *)(local_8 + 8); iVar10 = iVar10 + 1) {
      lVar9 = *(long *)(*(long *)(local_8 + 0x28) + (long)iVar10 * 8);
      for (local_9c = 0; (int)local_9c < 10; local_9c = local_9c + 1) {
        if (*(long *)(lVar9 + 0x98 + (long)(int)local_9c * 8) != 0) {
          snprintf(local_b8,0x10,"src %d",(ulong)local_9c);
          ggml_graph_dump_dot_leaf_edge
                    ((FILE *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        }
      }
    }
    fprintf(__stream,"}\n");
    fclose(__stream);
    ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: dot -Tpng %s -o %s.png && open %s.png\n",
                      "ggml_graph_dump_dot",local_18,local_18,local_18);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x186c,
             "GGML_ASSERT(%s) failed","fp");
}

Assistant:

void ggml_graph_dump_dot(const struct ggml_cgraph * gb, const struct ggml_cgraph * gf, const char * filename) {
    char color[16];

    FILE * fp = ggml_fopen(filename, "w");
    GGML_ASSERT(fp);

    fprintf(fp, "digraph G {\n");
    fprintf(fp, "  newrank = true;\n");
    fprintf(fp, "  rankdir = TB;\n");

    for (int i = 0; i < gb->n_nodes; i++) {
        struct ggml_tensor * node = gb->nodes[i];
        struct ggml_tensor * grad = ggml_graph_get_grad(gb, node);

        if (ggml_graph_get_parent(gb, node) != NULL) {
            continue;
        }

        if (node->flags & GGML_TENSOR_FLAG_PARAM) {
            snprintf(color, sizeof(color), "yellow");
        } else if (grad) {
            if (ggml_graph_find(gf, node)) {
                snprintf(color, sizeof(color), "green");
            } else {
                snprintf(color, sizeof(color), "lightblue");
            }
        } else {
            snprintf(color, sizeof(color), "white");
        }

        fprintf(fp, "  \"%p\" [ "
                    "style = filled; fillcolor = %s; shape = record; "
                    "label=\"",
                (void *) node, color);

        if (strlen(node->name) > 0) {
            fprintf(fp, "%s (%s)|", node->name, ggml_type_name(node->type));
        } else {
            fprintf(fp, "(%s)|", ggml_type_name(node->type));
        }

        if (ggml_is_matrix(node)) {
            fprintf(fp, "%d [%" PRId64 ", %" PRId64 "] | <x>%s", i, node->ne[0], node->ne[1], ggml_op_symbol(node->op));
        } else {
            fprintf(fp, "%d [%" PRId64 ", %" PRId64 ", %" PRId64 "] | <x>%s", i, node->ne[0], node->ne[1], node->ne[2], ggml_op_symbol(node->op));
        }

        if (grad) {
            fprintf(fp, " | <g>%s\"; ]\n", ggml_op_symbol(grad->op));
        } else {
            fprintf(fp, "\"; ]\n");
        }
    }

    for (int i = 0; i < gb->n_leafs; i++) {
        struct ggml_tensor * node = gb->leafs[i];

        snprintf(color, sizeof(color), "pink");

        fprintf(fp, "  \"%p\" [ "
                    "style = filled; fillcolor = %s; shape = record; "
                    "label=\"<x>",
                (void *) node, color);

        if (strlen(node->name) > 0) {
            fprintf(fp, "%s (%s)|", node->name, ggml_type_name(node->type));
        } else {
            fprintf(fp, "(%s)|", ggml_type_name(node->type));
        }

        fprintf(fp, "CONST %d [%" PRId64 ", %" PRId64 "]", i, node->ne[0], node->ne[1]);
        if (ggml_nelements(node) < 5 && node->data != NULL) {
            fprintf(fp, " | (");
            for (int j = 0; j < ggml_nelements(node); j++) {
                // FIXME: use ggml-backend to obtain the tensor data
                //if (node->type == GGML_TYPE_I8 || node->type == GGML_TYPE_I16 || node->type == GGML_TYPE_I32) {
                //    fprintf(fp, "%d", ggml_get_i32_1d(node, j));
                //}
                //else if (node->type == GGML_TYPE_F32 ||
                //         node->type == GGML_TYPE_F16 ||
                //         node->type == GGML_TYPE_BF16) {
                //    fprintf(fp, "%.1e", (double)ggml_get_f32_1d(node, j));
                //}
                //else
                {
                    fprintf(fp, "#");
                }
                if (j < ggml_nelements(node) - 1) {
                    fprintf(fp, ", ");
                }
            }
            fprintf(fp, ")");
        }
        fprintf(fp, "\"; ]\n");
    }

    for (int i = 0; i < gb->n_nodes; i++) {
        struct ggml_tensor * node = gb->nodes[i];

        for (int j = 0; j < GGML_MAX_SRC; j++) {
            if (node->src[j]) {
                char label[16];
                snprintf(label, sizeof(label), "src %d", j);
                ggml_graph_dump_dot_node_edge(fp, gb, node, node->src[j], label);
            }
        }
    }

    for (int i = 0; i < gb->n_leafs; i++) {
        struct ggml_tensor * node = gb->leafs[i];

        for (int j = 0; j < GGML_MAX_SRC; j++) {
            if (node->src[j]) {
                char label[16];
                snprintf(label, sizeof(label), "src %d", j);
                ggml_graph_dump_dot_leaf_edge(fp, node, node->src[j], label);
            }
        }
    }

    fprintf(fp, "}\n");

    fclose(fp);

    GGML_LOG_INFO("%s: dot -Tpng %s -o %s.png && open %s.png\n", __func__, filename, filename, filename);
}